

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * unixNextSystemCall(sqlite3_vfs *p,char *zName)

{
  int iVar1;
  char *in_RSI;
  int i;
  int local_1c;
  
  local_1c = -1;
  if (in_RSI != (char *)0x0) {
    local_1c = 0;
    while ((local_1c < 0x1c && (iVar1 = strcmp(in_RSI,aSyscall[local_1c].zName), iVar1 != 0))) {
      local_1c = local_1c + 1;
    }
  }
  do {
    local_1c = local_1c + 1;
    if (0x1c < local_1c) {
      return (char *)0x0;
    }
  } while (aSyscall[local_1c].pCurrent == (sqlite3_syscall_ptr)0x0);
  return aSyscall[local_1c].zName;
}

Assistant:

static const char *unixNextSystemCall(sqlite3_vfs *p, const char *zName){
  int i = -1;

  UNUSED_PARAMETER(p);
  if( zName ){
    for(i=0; i<ArraySize(aSyscall)-1; i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ) break;
    }
  }
  for(i++; i<ArraySize(aSyscall); i++){
    if( aSyscall[i].pCurrent!=0 ) return aSyscall[i].zName;
  }
  return 0;
}